

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::SnapshotEventLogEntry_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  SnapshotEventLogEntry *pSVar1;
  uint local_30;
  uint local_2c;
  uint32 i_1;
  uint32 i;
  SnapshotEventLogEntry *snapEvt;
  ThreadContext *threadContext_local;
  FileWriter *writer_local;
  EventLogEntry *evt_local;
  
  pSVar1 = GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                     (evt);
  FileWriter::WriteInt64(writer,restoreTime,pSVar1->RestoreTimestamp,CommaSeparator);
  FileWriter::WriteLengthValue(writer,pSVar1->LiveContextCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (local_2c = 0; local_2c < pSVar1->LiveContextCount; local_2c = local_2c + 1) {
    (*writer->_vptr_FileWriter[0x13])
              (writer,pSVar1->LiveContextIdArray[local_2c],(ulong)(local_2c != 0));
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLengthValue(writer,pSVar1->LongLivedRefRootsCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (local_30 = 0; local_30 < pSVar1->LongLivedRefRootsCount; local_30 = local_30 + 1) {
    (*writer->_vptr_FileWriter[0x13])
              (writer,pSVar1->LongLivedRefRootsIdArray[local_30],(ulong)(local_30 != 0));
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  if (pSVar1->Snap != (SnapShot *)0x0) {
    SnapShot::EmitSnapshot(pSVar1->Snap,pSVar1->RestoreTimestamp,threadContext);
  }
  return;
}

Assistant:

void SnapshotEventLogEntry_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const SnapshotEventLogEntry* snapEvt = GetInlineEventDataAs<SnapshotEventLogEntry, EventKind::SnapshotTag>(evt);

            writer->WriteInt64(NSTokens::Key::restoreTime, snapEvt->RestoreTimestamp, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(snapEvt->LiveContextCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapEvt->LiveContextCount; ++i)
            {
                writer->WriteNakedLogTag(snapEvt->LiveContextIdArray[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(snapEvt->LongLivedRefRootsCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapEvt->LongLivedRefRootsCount; ++i)
            {
                writer->WriteNakedLogTag(snapEvt->LongLivedRefRootsIdArray[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            if(snapEvt->Snap != nullptr)
            {
                snapEvt->Snap->EmitSnapshot(snapEvt->RestoreTimestamp, threadContext);
            }
        }